

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O0

void CPU::WDC65816::ProcessorStorageConstructor::absolute
               (AccessType type,bool is8bit,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  function<void_(CPU::WDC65816::MicroOp)> *target_local;
  bool is8bit_local;
  AccessType type_local;
  
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchIncrementPC);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchIncrementPC);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,OperationConstructAbsolute);
  read_write(type,is8bit,target);
  return;
}

Assistant:

static void absolute(AccessType type, bool is8bit, const std::function<void(MicroOp)> &target) {
		target(CycleFetchIncrementPC);					// AAL.
		target(CycleFetchIncrementPC);					// AAH.
		target(OperationConstructAbsolute);				// Calculate data address.

		read_write(type, is8bit, target);
	}